

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.h
# Opt level: O3

AffixMatcherWarehouse * __thiscall
icu_63::numparse::impl::AffixMatcherWarehouse::operator=
          (AffixMatcherWarehouse *this,AffixMatcherWarehouse *param_1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  void *pvVar6;
  void *pvVar7;
  
  lVar5 = 8;
  do {
    *(undefined4 *)((long)&this->fAffixMatchers[0].fSuffix + lVar5) =
         *(undefined4 *)((long)&param_1->fAffixMatchers[0].fSuffix + lVar5);
    puVar1 = (undefined8 *)
             ((long)&param_1->fAffixMatchers[0].super_NumberParseMatcher._vptr_NumberParseMatcher +
             lVar5);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)
             ((long)&this->fAffixMatchers[0].super_NumberParseMatcher._vptr_NumberParseMatcher +
             lVar5);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x128);
  lVar5 = 0;
  do {
    if (*(char *)((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray
                 + lVar5 + -4) != '\0') {
      uprv_free_63(*(void **)((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.
                                    fMatchers.stackArray + lVar5 + -0x10));
    }
    pvVar6 = (void *)((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.
                            stackArray + lVar5);
    iVar3 = *(int *)((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.
                           stackArray + lVar5 + -8);
    *(int *)((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray +
            lVar5 + -8) = iVar3;
    *(undefined1 *)
     ((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray +
     lVar5 + -4) = *(undefined1 *)
                    ((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.
                           stackArray + lVar5 + -4);
    pvVar7 = *(void **)((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.
                              stackArray + lVar5 + -0x10);
    if (pvVar6 == pvVar7) {
      pvVar7 = (void *)((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.
                              stackArray + lVar5);
      *(void **)((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray
                + lVar5 + -0x10) = pvVar7;
      memcpy(pvVar7,pvVar6,(long)iVar3 << 3);
    }
    else {
      *(void **)((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray
                + lVar5 + -0x10) = pvVar7;
      *(void **)((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.
                       stackArray + lVar5 + -0x10) = pvVar6;
      *(undefined4 *)
       ((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray +
       lVar5 + -8) = 3;
      *(undefined1 *)
       ((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray +
       lVar5 + -4) = 0;
    }
    *(undefined4 *)
     ((long)(&this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers + 1) + lVar5) =
         *(undefined4 *)
          ((long)(&param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers + 1) + lVar5
          );
    if (*(char *)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar5 + -2) !=
        '\0') {
      uprv_free_63(*(void **)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray +
                             lVar5 + -0xe));
    }
    pvVar6 = (void *)((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar5);
    iVar3 = *(int *)((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray +
                    lVar5 + -6);
    *(int *)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar5 + -6) = iVar3;
    *(undefined1 *)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar5 + -2) =
         *(undefined1 *)
          ((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar5 + -2);
    pvVar7 = *(void **)((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray +
                       lVar5 + -0xe);
    if (pvVar6 == pvVar7) {
      pvVar7 = (void *)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar5);
      *(void **)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar5 + -0xe) =
           pvVar7;
      memcpy(pvVar7,pvVar6,(long)iVar3 * 2);
    }
    else {
      *(void **)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar5 + -0xe) =
           pvVar7;
      *(void **)((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar5 + -0xe)
           = pvVar6;
      *(undefined4 *)
       ((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar5 + -6) = 4;
      *(undefined1 *)
       ((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar5 + -2) = 0;
    }
    lVar5 = lVar5 + 0x50;
  } while (lVar5 != 0x1e0);
  this->fTokenWarehouse = param_1->fTokenWarehouse;
  return this;
}

Assistant:

AffixMatcherWarehouse() = default;